

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack8_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  
  auVar15._8_8_ = 0x1000000008;
  auVar15._0_8_ = 0x1000000008;
  uVar1 = *in;
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar7 = vpmovsxbd_avx512f(_DAT_0018b9f0);
  auVar8 = vpmovsxbd_avx512f(_DAT_001a4820);
  auVar9 = vbroadcasti32x4_avx512f(_DAT_001a4df0);
  auVar10 = vbroadcasti32x4_avx512f(_DAT_001a50e0);
  auVar6 = vpbroadcastd_avx512vl();
  auVar11 = vpbroadcastd_avx512f();
  auVar2 = vpshufd_avx(auVar15,0x50);
  auVar3 = vpsrlvd_avx2(auVar11._0_16_,auVar15);
  auVar4 = vpsrlvd_avx2(auVar16,auVar2);
  auVar4 = vpblendd_avx2(auVar4,auVar16,1);
  auVar11 = vpbroadcastd_avx512f();
  auVar12 = vinserti32x8_avx512dq(ZEXT1664(auVar15),auVar6,0);
  auVar16 = vpsrlvd_avx2(auVar6._0_16_,auVar2);
  auVar5 = vpsrlvd_avx2(auVar11._0_16_,auVar15);
  auVar6._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar15;
  auVar6._16_16_ = ZEXT116(1) * auVar16;
  auVar6 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar12._16_4_,auVar4)),auVar6,0x60);
  auVar11 = vpbroadcastd_avx512f();
  auVar11 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar11._32_4_,auVar6)),auVar7,ZEXT1664(auVar3));
  auVar12 = vpbroadcastd_avx512f();
  auVar13._0_48_ = auVar11._0_48_;
  auVar13._48_4_ = auVar12._48_4_;
  auVar13._52_4_ = auVar11._52_4_;
  auVar13._56_4_ = auVar11._56_4_;
  auVar13._60_4_ = auVar11._60_4_;
  auVar11 = vpbroadcastd_avx512f();
  auVar12 = vpshufd_avx512f(auVar13,0);
  auVar13 = vpermt2d_avx512f(auVar13,auVar8,ZEXT1664(auVar5));
  auVar4 = vpsrlvd_avx2(auVar11._0_16_,auVar15);
  auVar11 = vpandd_avx512f(auVar13,auVar9);
  auVar12 = vpsrlvd_avx512f(auVar12,auVar10);
  auVar14._0_12_ = auVar11._0_12_;
  auVar14._12_4_ = auVar12._12_4_;
  auVar14._16_4_ = auVar11._16_4_;
  auVar14._20_4_ = auVar11._20_4_;
  auVar14._24_4_ = auVar11._24_4_;
  auVar14._28_4_ = auVar12._28_4_;
  auVar14._32_4_ = auVar11._32_4_;
  auVar14._36_4_ = auVar11._36_4_;
  auVar14._40_4_ = auVar11._40_4_;
  auVar14._44_4_ = auVar12._44_4_;
  auVar14._48_4_ = auVar11._48_4_;
  auVar14._52_4_ = auVar11._52_4_;
  auVar14._60_4_ = auVar12._60_4_;
  auVar14._56_4_ = auVar11._56_4_;
  auVar6 = vpbroadcastd_avx512vl();
  auVar11 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])out = auVar11;
  uVar1 = in[4];
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar11 = vpbroadcastd_avx512f();
  auVar3 = vpsrlvd_avx2(auVar11._0_16_,auVar15);
  auVar16 = vpsrlvd_avx2(auVar17,auVar2);
  auVar5 = vpsrlvd_avx2(auVar6._0_16_,auVar2);
  auVar2 = vpblendd_avx2(auVar16,auVar17,1);
  auVar18._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar3;
  auVar18._16_16_ = ZEXT116(1) * auVar5;
  auVar11 = vinserti32x8_avx512dq(ZEXT1664(auVar3),auVar6,0);
  auVar6 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar11._16_4_,auVar2)),auVar18,0x60);
  auVar11 = vpbroadcastd_avx512f();
  auVar11 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar11._32_4_,auVar6)),auVar7,ZEXT1664(auVar4));
  auVar7 = vpbroadcastd_avx512f();
  auVar12._0_48_ = auVar11._0_48_;
  auVar12._48_4_ = auVar7._48_4_;
  auVar12._52_4_ = auVar11._52_4_;
  auVar12._56_4_ = auVar11._56_4_;
  auVar12._60_4_ = auVar11._60_4_;
  auVar11 = vpermi2d_avx512f(auVar8,auVar12,ZEXT1664(auVar3));
  auVar7 = vpshufd_avx512f(auVar12,0);
  auVar11 = vpandd_avx512f(auVar11,auVar9);
  auVar7 = vpsrlvd_avx512f(auVar7,auVar10);
  auVar8._0_12_ = auVar11._0_12_;
  auVar8._12_4_ = auVar7._12_4_;
  auVar8._16_4_ = auVar11._16_4_;
  auVar8._20_4_ = auVar11._20_4_;
  auVar8._24_4_ = auVar11._24_4_;
  auVar8._28_4_ = auVar7._28_4_;
  auVar8._32_4_ = auVar11._32_4_;
  auVar8._36_4_ = auVar11._36_4_;
  auVar8._40_4_ = auVar11._40_4_;
  auVar8._44_4_ = auVar7._44_4_;
  auVar8._48_4_ = auVar11._48_4_;
  auVar8._52_4_ = auVar11._52_4_;
  auVar8._60_4_ = auVar7._60_4_;
  auVar8._56_4_ = auVar11._56_4_;
  auVar11 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])(out + 0x10) = auVar11;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack8_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;

  return in;
}